

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quark.c
# Opt level: O3

qrk_t * qrk_new(void)

{
  qrk_t *pqVar1;
  leaf_s **pplVar2;
  
  pqVar1 = (qrk_t *)xmalloc(0x28);
  pqVar1->root = (node_s *)0x0;
  pqVar1->count = 0;
  pqVar1->lock = false;
  pqVar1->size = 0x80;
  pplVar2 = (leaf_s **)xmalloc(0x400);
  pqVar1->leafs = pplVar2;
  return pqVar1;
}

Assistant:

qrk_t *qrk_new(void) {
	const uint64_t size = 128;
	qrk_t *qrk = xmalloc(sizeof(qrk_t));
	qrk->root  = NULL;
	qrk->count = 0;
	qrk->lock  = false;
	qrk->size  = size;
	qrk->leafs = xmalloc(sizeof(leaf_t *) * size);
	return qrk;
}